

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O2

void bubble_down(nghttp2_pq *pq,size_t index)

{
  nghttp2_pq_entry **ppnVar1;
  nghttp2_pq_entry *pnVar2;
  nghttp2_pq_entry *pnVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  
  while( true ) {
    uVar7 = index * 2;
    lVar5 = 2;
    sVar6 = index;
    while( true ) {
      uVar7 = uVar7 + 1;
      bVar8 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if ((bVar8) || (pq->length <= uVar7)) break;
      iVar4 = (*pq->less)(pq->q[uVar7],pq->q[sVar6]);
      if (iVar4 != 0) {
        sVar6 = uVar7;
      }
    }
    if (sVar6 == index) break;
    ppnVar1 = pq->q;
    pnVar2 = ppnVar1[index];
    pnVar3 = ppnVar1[sVar6];
    ppnVar1[index] = pnVar3;
    pnVar3->index = index;
    pq->q[sVar6] = pnVar2;
    pnVar2->index = sVar6;
    index = sVar6;
  }
  return;
}

Assistant:

static void bubble_down(nghttp2_pq *pq, size_t index) {
  size_t i, j, minindex;
  for (;;) {
    j = index * 2 + 1;
    minindex = index;
    for (i = 0; i < 2; ++i, ++j) {
      if (j >= pq->length) {
        break;
      }
      if (pq->less(pq->q[j], pq->q[minindex])) {
        minindex = j;
      }
    }
    if (minindex == index) {
      return;
    }
    swap(pq, index, minindex);
    index = minindex;
  }
}